

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void address_space_update_topology_pass
               (AddressSpace *as,FlatView *old_view,FlatView *new_view,_Bool adding)

{
  FlatRange *pFVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  MemoryListener *pMVar7;
  ulong uVar8;
  _Bool _Var9;
  uint uVar10;
  uint uVar11;
  FlatRange *b;
  FlatRange *a;
  QTailQLink **ppQVar12;
  anon_union_16_2_aaf24f3d_for_link_as *paVar13;
  MemoryRegionSection mrs;
  MemoryRegionSection local_78;
  
  uVar11 = 0;
  uVar10 = 0;
  do {
LAB_00b1385e:
    if (uVar10 < old_view->nr) {
      pFVar1 = old_view->ranges;
      a = pFVar1 + uVar10;
      if (uVar11 < new_view->nr) {
        b = new_view->ranges + uVar11;
        if (pFVar1 != (FlatRange *)0x0) {
          if (new_view->ranges == (FlatRange *)0x0) break;
          uVar2 = (ulong)(a->addr).start;
          lVar3 = *(long *)((long)&(a->addr).start + 8);
          uVar4 = (ulong)(b->addr).start;
          lVar5 = *(long *)((long)&(b->addr).start + 8);
          uVar8 = (ulong)(uVar2 < uVar4);
          if (((SBORROW8(lVar3,lVar5) != SBORROW8(lVar3 - lVar5,uVar8)) !=
               (long)((lVar3 - lVar5) - uVar8) < 0) ||
             ((lVar3 == lVar5 && uVar2 == uVar4 && (_Var9 = flatrange_equal(a,b), !_Var9)))) break;
          _Var9 = flatrange_equal(a,b);
          if (_Var9) {
            if (adding) {
              section_from_flat_range(&local_78,b,as->current_map);
              paVar13 = (anon_union_16_2_aaf24f3d_for_link_as *)&as->listeners;
              while (pMVar7 = paVar13->tqe_next, pMVar7 != (MemoryListener *)0x0) {
                if (pMVar7->region_nop !=
                    (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
                  (*pMVar7->region_nop)(pMVar7,&local_78);
                }
                paVar13 = &pMVar7->link_as;
              }
            }
            uVar10 = uVar10 + 1;
            goto LAB_00b13a05;
          }
        }
      }
      else {
        if (pFVar1 != (FlatRange *)0x0) break;
        b = (FlatRange *)0x0;
      }
    }
    else {
      if (new_view->nr <= uVar11) {
        return;
      }
      b = new_view->ranges + uVar11;
    }
    if (adding) {
      section_from_flat_range(&local_78,b,as->current_map);
      paVar13 = (anon_union_16_2_aaf24f3d_for_link_as *)&as->listeners;
      while (pMVar7 = paVar13->tqe_next, pMVar7 != (MemoryListener *)0x0) {
        if (pMVar7->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
          (*pMVar7->region_add)(pMVar7,&local_78);
        }
        paVar13 = &pMVar7->link_as;
      }
    }
LAB_00b13a05:
    uVar11 = uVar11 + 1;
  } while( true );
  if (!adding) {
    section_from_flat_range(&local_78,a,as->current_map);
    ppQVar12 = &(as->listeners).tqh_circ.tql_prev;
    while (pvVar6 = (*ppQVar12)->tql_prev->tql_next, pvVar6 != (void *)0x0) {
      if (*(code **)((long)pvVar6 + 0x18) != (code *)0x0) {
        (**(code **)((long)pvVar6 + 0x18))(pvVar6,&local_78);
      }
      ppQVar12 = (QTailQLink **)((long)pvVar6 + 0x48);
    }
  }
  uVar10 = uVar10 + 1;
  goto LAB_00b1385e;
}

Assistant:

static void address_space_update_topology_pass(AddressSpace *as,
                                               const FlatView *old_view,
                                               const FlatView *new_view,
                                               bool adding)
{
    unsigned iold, inew;
    FlatRange *frold, *frnew;

    /* Generate a symmetric difference of the old and new memory maps.
     * Kill ranges in the old map, and instantiate ranges in the new map.
     */
    iold = inew = 0;
    while (iold < old_view->nr || inew < new_view->nr) {
        if (iold < old_view->nr) {
            frold = &old_view->ranges[iold];
        } else {
            frold = NULL;
        }
        if (inew < new_view->nr) {
            frnew = &new_view->ranges[inew];
        } else {
            frnew = NULL;
        }

        if (frold
            && (!frnew
                || int128_lt(frold->addr.start, frnew->addr.start)
                || (int128_eq(frold->addr.start, frnew->addr.start)
                    && !flatrange_equal(frold, frnew)))) {
            /* In old but not in new, or in both but attributes changed. */

            if (!adding) {
                MEMORY_LISTENER_UPDATE_REGION(frold, as, Reverse, region_del);
            }

            ++iold;
        } else if (frold && frnew && flatrange_equal(frold, frnew)) {
            /* In both and unchanged (except logging may have changed) */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_nop);
            }

            ++iold;
            ++inew;
        } else {
            /* In new */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_add);
            }

            ++inew;
        }
    }
}